

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  __sighandler_t p_Var4;
  int local_bc;
  int _saved_errno;
  int n;
  int fd;
  int err;
  int use_fd;
  int close_fd;
  sigset_t set;
  int error_fd_local;
  int (*pipes_local) [2];
  int stdio_count_local;
  uv_process_options_t *options_local;
  
  set.__val[0xf]._4_4_ = error_fd;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  for (_saved_errno = 0; _saved_errno < stdio_count; _saved_errno = _saved_errno + 1) {
    iVar2 = pipes[_saved_errno][1];
    if ((-1 < iVar2) && (iVar2 < _saved_errno)) {
      iVar1 = fcntl64(iVar2,0,stdio_count);
      iVar2 = set.__val[0xf]._4_4_;
      pipes[_saved_errno][1] = iVar1;
      if (pipes[_saved_errno][1] == -1) {
        piVar3 = __errno_location();
        uv__write_int(iVar2,-*piVar3);
        _exit(0x7f);
      }
    }
  }
  _saved_errno = 0;
  do {
    if (stdio_count <= _saved_errno) {
      for (_saved_errno = 0; _saved_errno < stdio_count; _saved_errno = _saved_errno + 1) {
        if (stdio_count <= pipes[_saved_errno][1]) {
          uv__close(pipes[_saved_errno][1]);
        }
      }
      if ((options->cwd != (char *)0x0) &&
         (iVar1 = chdir(options->cwd), iVar2 = set.__val[0xf]._4_4_, iVar1 != 0)) {
        piVar3 = __errno_location();
        uv__write_int(iVar2,-*piVar3);
        _exit(0x7f);
      }
      if ((options->flags & 3) != 0) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        setgroups(0,(__gid_t *)0x0);
        piVar3 = __errno_location();
        *piVar3 = iVar2;
      }
      if (((options->flags & 2) != 0) &&
         (iVar1 = setgid(options->gid), iVar2 = set.__val[0xf]._4_4_, iVar1 != 0)) {
        piVar3 = __errno_location();
        uv__write_int(iVar2,-*piVar3);
        _exit(0x7f);
      }
      if (((options->flags & 1) != 0) &&
         (iVar1 = setuid(options->uid), iVar2 = set.__val[0xf]._4_4_, iVar1 != 0)) {
        piVar3 = __errno_location();
        uv__write_int(iVar2,-*piVar3);
        _exit(0x7f);
      }
      if (options->env != (char **)0x0) {
        _environ = options->env;
      }
      local_bc = 1;
      while( true ) {
        if (0x1f < local_bc) {
          sigemptyset((sigset_t *)&use_fd);
          iVar2 = pthread_sigmask(2,(__sigset_t *)&use_fd,(__sigset_t *)0x0);
          if (iVar2 == 0) {
            execvp(options->file,options->args);
            iVar2 = set.__val[0xf]._4_4_;
            piVar3 = __errno_location();
            uv__write_int(iVar2,-*piVar3);
            _exit(0x7f);
          }
          uv__write_int(set.__val[0xf]._4_4_,-iVar2);
          _exit(0x7f);
        }
        if (((local_bc != 9) && (local_bc != 0x13)) &&
           (p_Var4 = signal(local_bc,(__sighandler_t)0x0), iVar2 = set.__val[0xf]._4_4_,
           p_Var4 == (__sighandler_t)0xffffffffffffffff)) break;
        local_bc = local_bc + 1;
      }
      piVar3 = __errno_location();
      uv__write_int(iVar2,-*piVar3);
      _exit(0x7f);
    }
    err = pipes[_saved_errno][0];
    fd = pipes[_saved_errno][1];
    if (fd < 0) {
      if (_saved_errno < 3) {
        iVar2 = 2;
        if (_saved_errno == 0) {
          iVar2 = 0;
        }
        fd = open64("/dev/null",iVar2);
        iVar2 = set.__val[0xf]._4_4_;
        err = fd;
        if (fd < 0) {
          piVar3 = __errno_location();
          uv__write_int(iVar2,-*piVar3);
          _exit(0x7f);
        }
        goto LAB_0019c446;
      }
    }
    else {
LAB_0019c446:
      if (_saved_errno == fd) {
        uv__cloexec_fcntl(fd,0);
      }
      else {
        _saved_errno = dup2(fd,_saved_errno);
      }
      iVar2 = set.__val[0xf]._4_4_;
      if (_saved_errno == -1) {
        piVar3 = __errno_location();
        uv__write_int(iVar2,-*piVar3);
        _exit(0x7f);
      }
      if (_saved_errno < 3) {
        uv__nonblock_fcntl(_saved_errno,0);
      }
      if (stdio_count <= err) {
        uv__close(err);
      }
    }
    _saved_errno = _saved_errno + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0) {
          uv__write_int(error_fd, UV__ERR(errno));
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0) {
    uv__write_int(error_fd, UV__ERR(err));
    _exit(127);
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, UV__ERR(errno));
  _exit(127);
}